

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O0

void ShuffleDeck16(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  uint32_t uVar1;
  uint in_EDX;
  uint uVar2;
  uint uVar3;
  undefined2 *in_RSI;
  PCGRandom *in_RDI;
  uint32_t rv_1;
  uint32_t jj_1;
  uint32_t ii_1;
  uint32_t rv;
  uint32_t jj;
  uint32_t ii;
  uint local_24;
  uint local_18;
  
  *in_RSI = 0;
  if (in_EDX < 0x101) {
    local_18 = 1;
    do {
      uVar1 = siamese::PCGRandom::Next(in_RDI);
      switch(in_EDX - local_18) {
      case 0:
        return;
      case 3:
        uVar2 = (uVar1 & 0xff) % local_18;
        in_RSI[local_18] = in_RSI[uVar2];
        in_RSI[uVar2] = (short)local_18;
        local_18 = local_18 + 1;
      case 2:
        uVar2 = (uVar1 >> 8 & 0xff) % local_18;
        in_RSI[local_18] = in_RSI[uVar2];
        in_RSI[uVar2] = (short)local_18;
        local_18 = local_18 + 1;
      case 1:
        uVar2 = (uVar1 >> 0x10 & 0xff) % local_18;
        in_RSI[local_18] = in_RSI[uVar2];
        in_RSI[uVar2] = (short)local_18;
        return;
      default:
        uVar2 = (uVar1 & 0xff) % local_18;
        in_RSI[local_18] = in_RSI[uVar2];
        in_RSI[uVar2] = (short)local_18;
        uVar2 = local_18 + 1;
        uVar3 = (uVar1 >> 8 & 0xff) % uVar2;
        in_RSI[uVar2] = in_RSI[uVar3];
        in_RSI[uVar3] = (short)uVar2;
        uVar2 = local_18 + 2;
        uVar3 = (uVar1 >> 0x10 & 0xff) % uVar2;
        in_RSI[uVar2] = in_RSI[uVar3];
        in_RSI[uVar3] = (short)uVar2;
        uVar2 = local_18 + 3;
        uVar3 = (uVar1 >> 0x18) % uVar2;
        in_RSI[uVar2] = in_RSI[uVar3];
        in_RSI[uVar3] = (short)uVar2;
        local_18 = local_18 + 4;
      }
    } while( true );
  }
  local_24 = 1;
  while( true ) {
    uVar1 = siamese::PCGRandom::Next(in_RDI);
    if (in_EDX == local_24) {
      return;
    }
    if (in_EDX - local_24 == 1) break;
    uVar2 = (uVar1 & 0xffff) % local_24;
    in_RSI[local_24] = in_RSI[uVar2];
    in_RSI[uVar2] = (short)local_24;
    uVar2 = local_24 + 1;
    uVar3 = (uVar1 >> 0x10) % uVar2;
    in_RSI[uVar2] = in_RSI[uVar3];
    in_RSI[uVar3] = (short)uVar2;
    local_24 = local_24 + 2;
  }
  uVar2 = (uVar1 & 0xffff) % local_24;
  in_RSI[local_24] = in_RSI[uVar2];
  in_RSI[uVar2] = (short)local_24;
  return;
}

Assistant:

void ShuffleDeck16(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
    deck[0] = 0;

    // If we can unroll 4 times:
    if (count <= 256)
    {
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 8-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 24) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 3:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 2:
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 1:
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
    else
    {
        // For each deck entry:
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 16-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint16_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 1:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
}